

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O0

int __thiscall DIS::RecordQueryReliablePdu::getMarshalledSize(RecordQueryReliablePdu *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_30 [8];
  FourByteChunk listElement;
  unsigned_long_long idx;
  int marshalSize;
  RecordQueryReliablePdu *this_local;
  
  iVar2 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  idx._4_4_ = iVar2 + 0x12;
  listElement._otherParameters[0] = '\0';
  listElement._otherParameters[1] = '\0';
  listElement._otherParameters[2] = '\0';
  listElement._otherParameters[3] = '\0';
  listElement._12_4_ = 0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar3 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::size
                      (&this->_recordIDs);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::operator[]
                       (&this->_recordIDs,listElement._8_8_);
    FourByteChunk::FourByteChunk((FourByteChunk *)local_30,pvVar4);
    iVar2 = FourByteChunk::getMarshalledSize((FourByteChunk *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    FourByteChunk::~FourByteChunk((FourByteChunk *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int RecordQueryReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 2;  // _eventType
   marshalSize = marshalSize + 4;  // _time
   marshalSize = marshalSize + 4;  // _numberOfRecords

   for(unsigned long long idx=0; idx < _recordIDs.size(); idx++)
   {
        FourByteChunk listElement = _recordIDs[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}